

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O2

int Vertical_Scrolling(_func_int_FORM_ptr *fct,FORM *form)

{
  int iVar1;
  
  if ((int)form->current->rows + form->current->nrow == 1) {
    iVar1 = -0xc;
  }
  else {
    iVar1 = (*fct)(form);
    if (iVar1 == 0) {
      form->current->status = form->current->status | 2;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static int Vertical_Scrolling(int (* const fct) (FORM *), FORM * form)
{
  int res = E_REQUEST_DENIED;

  if (!Single_Line_Field(form->current))
    {
      res = fct(form);
      if (res == E_OK)
        form->current->status |= _NEWTOP;
    }
  return(res);
}